

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol ** Symbol_arrayof(void)

{
  uint uVar1;
  s_x2 *psVar2;
  symbol **ppsVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  if (x2a == (s_x2 *)0x0) {
    ppsVar3 = (symbol **)0x0;
  }
  else {
    uVar1 = x2a->count;
    ppsVar3 = (symbol **)lemon_calloc((long)(int)uVar1,8);
    psVar2 = x2a;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 * 8 != lVar5; lVar5 = lVar5 + 8) {
      *(undefined8 *)((long)ppsVar3 + lVar5) = *(undefined8 *)((long)&psVar2->tbl->data + lVar5 * 4)
      ;
    }
  }
  return ppsVar3;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,arrSize;
  if( x2a==0 ) return 0;
  arrSize = x2a->count;
  array = (struct symbol **)lemon_calloc(arrSize, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<arrSize; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}